

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

size_t doh_probe_write_cb(char *contents,size_t size,size_t nmemb,void *userp)

{
  CURLcode CVar1;
  void *pvVar2;
  size_t sVar3;
  
  pvVar2 = Curl_meta_get((Curl_easy *)userp,"ezm:doh-p");
  if (pvVar2 == (void *)0x0) {
    sVar3 = 0xffffffff;
  }
  else {
    CVar1 = Curl_dyn_addn((dynbuf *)((long)pvVar2 + 0x118),contents,nmemb * size);
    sVar3 = 0;
    if (CVar1 == CURLE_OK) {
      sVar3 = nmemb * size;
    }
  }
  return sVar3;
}

Assistant:

static size_t
doh_probe_write_cb(char *contents, size_t size, size_t nmemb, void *userp)
{
  size_t realsize = size * nmemb;
  struct Curl_easy *data = userp;
  struct doh_request *doh_req = Curl_meta_get(data, CURL_EZM_DOH_PROBE);
  if(!doh_req)
    return CURL_WRITEFUNC_ERROR;

  if(Curl_dyn_addn(&doh_req->resp_body, contents, realsize))
    return 0;

  return realsize;
}